

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O0

error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> * __thiscall
pstore::romfs::romfs::parse_path
          (error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> *__return_storage_ptr__,
          romfs *this,not_null<const_char_*> path,not_null<const_pstore::romfs::directory_*> dir)

{
  bool bVar1;
  char *pcVar2;
  directory *pdVar3;
  unsigned_long length;
  reference pnVar4;
  error_code erc;
  error_code erc_00;
  error_code erc_01;
  error_code eVar5;
  undefined1 local_e8 [8];
  error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> eo_directory;
  pointer_based_iterator<const_pstore::romfs::dirent> local_c0;
  not_null<const_char_*> local_b8;
  pointer_based_iterator<const_pstore::romfs::dirent> local_b0;
  iterator component_pos;
  tuple<char_const*&,char_const*&> local_98 [16];
  pair<const_char_*,_const_char_*> local_88;
  char *local_78;
  char *tail;
  char *component;
  dirent *local_60;
  dirent *local_58;
  dirent *current_de;
  char *local_48;
  directory *local_40;
  not_null<const_char_*> p;
  romfs *this_local;
  not_null<const_pstore::romfs::directory_*> dir_local;
  not_null<const_char_*> path_local;
  
  this_local = (romfs *)dir.ptr_;
  dir_local.ptr_ = (directory *)path.ptr_;
  pcVar2 = pstore::gsl::not_null<const_char_*>::get((not_null<const_char_*> *)&dir_local);
  if ((pcVar2 == (char *)0x0) ||
     (pdVar3 = pstore::gsl::not_null<const_pstore::romfs::directory_*>::get
                         ((not_null<const_pstore::romfs::directory_*> *)&this_local),
     pdVar3 == (directory *)0x0)) {
    eVar5 = make_error_code(enoent);
    p.ptr_._0_4_ = eVar5._M_value;
    eVar5._4_4_ = 0;
    eVar5._M_value = (uint)p.ptr_;
    error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::error_or
              (__return_storage_ptr__,eVar5);
  }
  else {
    local_40 = dir_local.ptr_;
    pcVar2 = pstore::gsl::not_null::operator_cast_to_char_((not_null *)&local_40);
    if (*pcVar2 == '/') {
      this_local = (romfs *)(this->root_).ptr_;
      current_de = (dirent *)dir_local.ptr_;
      local_48 = (char *)anon_unknown.dwarf_179e62::next_component
                                   ((not_null<const_char_*>)dir_local.ptr_);
      local_40 = (directory *)local_48;
    }
    component = (char *)this_local;
    local_60 = (dirent *)directory_to_dirent((not_null<const_pstore::romfs::directory_*>)this_local)
    ;
    local_58 = pstore::gsl::not_null::operator_cast_to_dirent_((not_null *)&local_60);
    bVar1 = dirent::is_directory(local_58);
    if (!bVar1) {
      assert_failed("current_de->is_directory ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/romfs/romfs.cpp"
                    ,0x143);
    }
    do {
      while( true ) {
        pcVar2 = pstore::gsl::not_null::operator_cast_to_char_((not_null *)&local_40);
        if (*pcVar2 == '\0') {
          error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
          error_or<pstore::romfs::dirent_const*&,void>
                    ((error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>> *)
                     __return_storage_ptr__,&local_58);
          return __return_storage_ptr__;
        }
        pcVar2 = pstore::gsl::not_null::operator_cast_to_char_((not_null *)&local_40);
        local_88 = anon_unknown.dwarf_179e62::path_component(pcVar2);
        std::tie<char_const*,char_const*>((char **)local_98,&tail);
        std::tuple<char_const*&,char_const*&>::operator=(local_98,&local_88);
        pstore::gsl::not_null<const_char_*>::not_null
                  ((not_null<const_char_*> *)&component_pos,local_78);
        local_40 = (directory *)
                   anon_unknown.dwarf_179e62::next_component
                             ((not_null<const_char_*>)component_pos.pos_);
        if (local_78 <= tail) {
          assert_failed("tail > component",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/romfs/romfs.cpp"
                        ,0x14b);
        }
        pdVar3 = pstore::gsl::not_null<const_pstore::romfs::directory_*>::operator->
                           ((not_null<const_pstore::romfs::directory_*> *)&this_local);
        pstore::gsl::not_null<const_char_*>::not_null(&local_b8,tail);
        length = unsigned_cast<long,unsigned_long,void>((long)local_78 - (long)tail);
        local_b0.pos_ = (pointer)directory::find(pdVar3,local_b8,length);
        pdVar3 = pstore::gsl::not_null<const_pstore::romfs::directory_*>::operator->
                           ((not_null<const_pstore::romfs::directory_*> *)&this_local);
        local_c0.pos_ = (pointer)directory::end(pdVar3);
        bVar1 = pointer_based_iterator<pstore::romfs::dirent_const>::operator==
                          ((pointer_based_iterator<pstore::romfs::dirent_const> *)&local_b0,
                           &local_c0);
        if (bVar1) {
          eVar5 = make_error_code(enoent);
          erc._M_cat = eVar5._M_cat;
          eo_directory._16_4_ = eVar5._M_value;
          erc._4_4_ = 0;
          erc._M_value = eo_directory._16_4_;
          error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::error_or
                    (__return_storage_ptr__,erc);
          return __return_storage_ptr__;
        }
        local_58 = pointer_based_iterator<const_pstore::romfs::dirent>::operator*(&local_b0);
        bVar1 = dirent::is_directory(local_58);
        if (bVar1) break;
        pcVar2 = pstore::gsl::not_null::operator_cast_to_char_((not_null *)&local_40);
        if (*pcVar2 != '\0') {
          eVar5 = make_error_code(enotdir);
          erc_01._M_cat = eVar5._M_cat;
          erc_01._4_4_ = 0;
          erc_01._M_value = eVar5._M_value;
          error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::error_or
                    (__return_storage_ptr__,erc_01);
          return __return_storage_ptr__;
        }
      }
      dirent::opendir((dirent *)local_e8,(char *)local_58);
      bVar1 = pstore::error_or::operator_cast_to_bool((error_or *)local_e8);
      if (bVar1) {
        pnVar4 = error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::get
                           ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                            local_e8);
        this_local = (romfs *)pnVar4->ptr_;
      }
      else {
        eVar5 = error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::get_error
                          ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                           local_e8);
        erc_00._M_cat = eVar5._M_cat;
        erc_00._4_4_ = 0;
        erc_00._M_value = eVar5._M_value;
        error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::error_or
                  (__return_storage_ptr__,erc_00);
      }
      error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::~error_or
                ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)local_e8);
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto romfs::parse_path (not_null<czstring> const path,
                                not_null<directory const *> dir) const -> error_or<dirent_ptr> {
            if (path.get () == nullptr || dir.get () == nullptr) {
                return error_or<dirent_ptr> (make_error_code (error_code::enoent));
            }

            auto p = path;
            if (p[0] == '/') {
                dir = root_;
                p = next_component (path);
            }

            dirent const * current_de = directory_to_dirent (dir);
            PSTORE_ASSERT (current_de->is_directory ());
            while (*p != '\0') {
                char const * component;
                char const * tail;
                std::tie (component, tail) = path_component (p);
                // note that component is not null terminated!
                p = next_component (tail);

                PSTORE_ASSERT (tail > component);
                auto const component_pos = dir->find (component, unsigned_cast (tail - component));
                if (component_pos == dir->end ()) {
                    // name not found
                    return error_or<dirent_ptr>{make_error_code (error_code::enoent)};
                }

                current_de = &*component_pos;
                if (current_de->is_directory ()) {
                    auto eo_directory = current_de->opendir ();
                    if (!eo_directory) {
                        return error_or<dirent_ptr>{eo_directory.get_error ()};
                    }
                    dir = eo_directory.get ();
                } else if (*p != '\0') {
                    // not a directory and wasn't the last component.
                    return error_or<dirent_ptr> (make_error_code (error_code::enotdir));
                }
            }
            return error_or<dirent_ptr>{current_de};
        }